

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O0

int nn_xsurveyor_create(void *hint,nn_sockbase **sockbase)

{
  nn_xsurveyor *self_00;
  nn_xsurveyor *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_xsurveyor *)nn_alloc_(0x1b0);
  if (self_00 == (nn_xsurveyor *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/xsurveyor.c"
            ,0xd0);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xsurveyor_init(self_00,&nn_xsurveyor_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

static int nn_xsurveyor_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xsurveyor *self;

    self = nn_alloc (sizeof (struct nn_xsurveyor), "socket (xsurveyor)");
    alloc_assert (self);
    nn_xsurveyor_init (self, &nn_xsurveyor_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}